

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

void MemoryProfiler::AccumulateData
               (ArenaMemoryDataSummary *arenaMemoryDataSummary,ArenaMemoryData *memoryData,
               bool reset)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  undefined3 in_register_00000011;
  
  psVar1 = &(arenaMemoryDataSummary->total).alignmentBytes;
  *psVar1 = *psVar1 + memoryData->alignmentBytes;
  (arenaMemoryDataSummary->total).allocatedBytes =
       (arenaMemoryDataSummary->total).allocatedBytes + memoryData->allocatedBytes;
  psVar1 = &(arenaMemoryDataSummary->total).freelistBytes;
  *psVar1 = *psVar1 + memoryData->freelistBytes;
  psVar1 = &(arenaMemoryDataSummary->total).freelistCount;
  *psVar1 = *psVar1 + memoryData->freelistCount;
  psVar1 = &(arenaMemoryDataSummary->total).requestBytes;
  *psVar1 = *psVar1 + memoryData->requestBytes;
  psVar1 = &(arenaMemoryDataSummary->total).requestCount;
  *psVar1 = *psVar1 + memoryData->requestCount;
  psVar1 = &(arenaMemoryDataSummary->total).reuseCount;
  *psVar1 = *psVar1 + memoryData->reuseCount;
  psVar1 = &(arenaMemoryDataSummary->total).reuseBytes;
  *psVar1 = *psVar1 + memoryData->reuseBytes;
  if (CONCAT31(in_register_00000011,reset) == 0) {
    psVar1 = &(arenaMemoryDataSummary->total).resetCount;
    *psVar1 = *psVar1 + memoryData->resetCount;
  }
  uVar2 = (arenaMemoryDataSummary->max).alignmentBytes;
  uVar3 = memoryData->alignmentBytes;
  if (memoryData->alignmentBytes < uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (arenaMemoryDataSummary->max).allocatedBytes;
  (arenaMemoryDataSummary->max).alignmentBytes = uVar3;
  uVar3 = memoryData->allocatedBytes;
  if (memoryData->allocatedBytes < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).allocatedBytes = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).freelistBytes;
  uVar3 = memoryData->freelistBytes;
  if (memoryData->freelistBytes < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).freelistBytes = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).freelistCount;
  uVar3 = memoryData->freelistCount;
  if (memoryData->freelistCount < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).freelistCount = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).requestBytes;
  uVar3 = memoryData->requestBytes;
  if (memoryData->requestBytes < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).requestBytes = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).requestCount;
  uVar3 = memoryData->requestCount;
  if (memoryData->requestCount < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).requestCount = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).reuseCount;
  uVar3 = memoryData->reuseCount;
  if (memoryData->reuseCount < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).reuseCount = uVar3;
  uVar2 = (arenaMemoryDataSummary->max).reuseBytes;
  uVar3 = memoryData->reuseBytes;
  if (memoryData->reuseBytes < uVar2) {
    uVar3 = uVar2;
  }
  (arenaMemoryDataSummary->max).reuseBytes = uVar3;
  if (!reset) {
    uVar2 = (arenaMemoryDataSummary->max).resetCount;
    uVar3 = memoryData->resetCount;
    if (memoryData->resetCount < uVar2) {
      uVar3 = uVar2;
    }
    (arenaMemoryDataSummary->max).resetCount = uVar3;
  }
  return;
}

Assistant:

void
MemoryProfiler::AccumulateData(ArenaMemoryDataSummary * arenaMemoryDataSummary,  ArenaMemoryData * memoryData, bool reset)
{
    arenaMemoryDataSummary->total.alignmentBytes += memoryData->alignmentBytes;
    arenaMemoryDataSummary->total.allocatedBytes += memoryData->allocatedBytes;
    arenaMemoryDataSummary->total.freelistBytes += memoryData->freelistBytes;
    arenaMemoryDataSummary->total.freelistCount += memoryData->freelistCount;
    arenaMemoryDataSummary->total.requestBytes += memoryData->requestBytes;
    arenaMemoryDataSummary->total.requestCount += memoryData->requestCount;
    arenaMemoryDataSummary->total.reuseCount += memoryData->reuseCount;
    arenaMemoryDataSummary->total.reuseBytes += memoryData->reuseBytes;
    if (!reset)
    {
        arenaMemoryDataSummary->total.resetCount += memoryData->resetCount;
    }

    arenaMemoryDataSummary->max.alignmentBytes = max(arenaMemoryDataSummary->max.alignmentBytes, memoryData->alignmentBytes);
    arenaMemoryDataSummary->max.allocatedBytes = max(arenaMemoryDataSummary->max.allocatedBytes, memoryData->allocatedBytes);
    arenaMemoryDataSummary->max.freelistBytes = max(arenaMemoryDataSummary->max.freelistBytes, memoryData->freelistBytes);
    arenaMemoryDataSummary->max.freelistCount = max(arenaMemoryDataSummary->max.freelistCount, memoryData->freelistCount);
    arenaMemoryDataSummary->max.requestBytes = max(arenaMemoryDataSummary->max.requestBytes, memoryData->requestBytes);
    arenaMemoryDataSummary->max.requestCount = max(arenaMemoryDataSummary->max.requestCount, memoryData->requestCount);
    arenaMemoryDataSummary->max.reuseCount = max(arenaMemoryDataSummary->max.reuseCount, memoryData->reuseCount);
    arenaMemoryDataSummary->max.reuseBytes = max(arenaMemoryDataSummary->max.reuseBytes, memoryData->reuseBytes);
    if (!reset)
    {
        arenaMemoryDataSummary->max.resetCount = max(arenaMemoryDataSummary->max.resetCount, memoryData->resetCount);
    }
}